

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void update_perf_tbl_with_bapcod_json_perf_data
               (AppCtx *ctx,PerfProfRunHandle *handle,char *json_filepath)

{
  cJSON *root_00;
  cJSON *root;
  PerfProfRun run;
  char *json_filepath_local;
  PerfProfRunHandle *handle_local;
  AppCtx *ctx_local;
  
  run.solution.stats[2] = (double)json_filepath;
  make_solver_run((PerfProfRun *)&root,ctx->current_batch,handle->solver_name);
  if ((run.solution.stats[2] != 0.0) &&
     (root_00 = load_json((char *)run.solution.stats[2]), root_00 != (cJSON *)0x0)) {
    parse_bapcod_solver_json_dump((PerfProfRun *)&root,root_00);
    cJSON_Delete(root_00);
  }
  store_perfprof_run(&ctx->perf_tbl,&(handle->input).uid,(PerfProfRun *)&root);
  return;
}

Assistant:

static void update_perf_tbl_with_bapcod_json_perf_data(
    AppCtx *ctx, PerfProfRunHandle *handle, char *json_filepath) {
    PerfProfRun run = make_solver_run(ctx->current_batch, handle->solver_name);
    if (json_filepath) {
        cJSON *root = load_json(json_filepath);
        if (root) {
            parse_bapcod_solver_json_dump(&run, root);
            cJSON_Delete(root);
        }
    }
    store_perfprof_run(&ctx->perf_tbl, &handle->input.uid, &run);
}